

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PPCInstPrinter.c
# Opt level: O0

void printMemRegReg(MCInst *MI,uint OpNo,SStream *O)

{
  uint uVar1;
  MCOperand *op;
  SStream *O_local;
  uint OpNo_local;
  MCInst *MI_local;
  
  op = MCInst_getOperand(MI,OpNo);
  uVar1 = MCOperand_getReg(op);
  if (uVar1 == 0x36) {
    SStream_concat0(O,"0");
  }
  else {
    printOperand(MI,OpNo,O);
  }
  SStream_concat0(O,", ");
  printOperand(MI,OpNo + 1,O);
  return;
}

Assistant:

static void printMemRegReg(MCInst *MI, unsigned OpNo, SStream *O)
{
	// When used as the base register, r0 reads constant zero rather than
	// the value contained in the register.  For this reason, the darwin
	// assembler requires that we print r0 as 0 (no r) when used as the base.
	if (MCOperand_getReg(MCInst_getOperand(MI, OpNo)) == PPC_R0)
		SStream_concat0(O, "0");
	else
		printOperand(MI, OpNo, O);
	SStream_concat0(O, ", ");

	printOperand(MI, OpNo + 1, O);
}